

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_attr<tinyusdz::value::AssetPath>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *attr,
                   string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Path *v;
  byte bVar3;
  string *psVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  long lVar8;
  uint32_t indent_00;
  undefined4 in_register_0000000c;
  pointer this;
  pointer pPVar9;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  byte bVar10;
  byte bVar11;
  AssetPath a;
  stringstream ss;
  uint32_t local_29c;
  AssetPath local_298;
  string *local_258;
  string *local_250;
  byte local_248;
  Animatable<tinyusdz::value::AssetPath> local_240;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (pointer)CONCAT44(in_register_0000000c,indent);
  pPVar9 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar6 = (attr->_attrib).has_value_;
  local_250 = __return_storage_ptr__;
  if (bVar6 == false) {
    pPVar9 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar9 != (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      bVar3 = 1;
      local_248 = bVar6;
      goto LAB_00305602;
    }
    if ((attr->_value_empty == false) && ((attr->_blocked & 1U) == 0)) goto LAB_00305bc7;
    bVar10 = (attr->_blocked ^ 1U) & attr->_value_empty;
    bVar3 = 0;
    local_248 = bVar6;
  }
  else {
    local_248 = bVar6;
    nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
    construct_value((storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)&local_240,
                    (value_type *)&(attr->_attrib).contained);
    bVar3 = 0;
LAB_00305602:
    bVar10 = 0;
  }
  bVar11 = local_240._has_value;
  indent_00 = (uint32_t)pPVar9;
  if ((local_248 & 1) == 0) {
    bVar11 = 0;
    local_29c = 0;
  }
  else {
    if (local_240._ts._dirty == true) {
      TypedTimeSamples<tinyusdz::value::AssetPath>::update(&local_240._ts);
    }
    indent_00 = (uint32_t)
                CONCAT71((int7)((ulong)local_240._ts._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_240._ts._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_240._ts._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    local_29c = indent_00;
  }
  if ((((local_248 & 1) == 0) || (local_240._blocked != false)) || (local_240._has_value != false))
  {
    bVar6 = false;
  }
  else {
    bVar6 = local_240._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_240._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar5 = AttrMetas::authored(&attr->_metas);
  if (((bVar5) || (!(bool)(bVar3 | bVar6))) ||
     (n_01 = n, ((bVar10 | attr->_blocked | bVar11) & 1) != 0)) {
    pprint::Indent_abi_cxx11_((string *)&local_298,(pprint *)this,n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_298.asset_path_._M_dataplus._M_p,
               local_298.asset_path_._M_string_length);
    paVar1 = &local_298.asset_path_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.asset_path_._M_dataplus._M_p,
                      CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                        local_298.asset_path_.field_2._M_allocated_capacity._0_4_))
                      + 1);
    }
    local_298.asset_path_.field_2._M_allocated_capacity._0_4_ = 0x65737361;
    local_298.asset_path_.field_2._M_allocated_capacity._4_2_ = 0x74;
    local_298.asset_path_._M_string_length = 5;
    local_298.asset_path_._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.asset_path_._M_dataplus._M_p,
                      CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                        local_298.asset_path_.field_2._M_allocated_capacity._0_4_))
                      + 1);
    }
    if (attr->_blocked == true) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
    }
    else if (bVar11 != 0) {
      paVar2 = &local_298.resolved_path_.field_2;
      local_298.asset_path_._M_string_length = 0;
      local_298.asset_path_.field_2._M_allocated_capacity._0_4_ =
           local_298.asset_path_.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_298.resolved_path_._M_string_length = 0;
      local_298.resolved_path_.field_2._M_local_buf[0] = '\0';
      local_298.asset_path_._M_dataplus._M_p = (pointer)paVar1;
      local_298.resolved_path_._M_dataplus._M_p = (pointer)paVar2;
      if (local_248 == 0) goto LAB_00305c0d;
      bVar6 = Animatable<tinyusdz::value::AssetPath>::get_scalar(&local_240,&local_298);
      if (bVar6) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
        ::std::operator<<(local_1a8,&local_298);
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = [InternalError]",0x12);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.resolved_path_._M_dataplus._M_p != paVar2) {
        operator_delete(local_298.resolved_path_._M_dataplus._M_p,
                        CONCAT71(local_298.resolved_path_.field_2._M_allocated_capacity._1_7_,
                                 local_298.resolved_path_.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.asset_path_._M_dataplus._M_p,
                        CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                          local_298.asset_path_.field_2._M_allocated_capacity._0_4_)
                                ) + 1);
      }
    }
    bVar6 = AttrMetas::authored(&attr->_metas);
    if (bVar6) {
      local_258 = name;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                ((string *)&local_298,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_298.asset_path_._M_dataplus._M_p,
                          local_298.asset_path_._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      name = local_258;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.asset_path_._M_dataplus._M_p,
                        CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                          local_298.asset_path_.field_2._M_allocated_capacity._0_4_)
                                ) + 1);
        name = local_258;
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if ((char)local_29c != '\0') {
    pprint::Indent_abi_cxx11_((string *)&local_298,(pprint *)this,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_298.asset_path_._M_dataplus._M_p,
               local_298.asset_path_._M_string_length);
    paVar1 = &local_298.asset_path_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.asset_path_._M_dataplus._M_p,
                      CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                        local_298.asset_path_.field_2._M_allocated_capacity._0_4_))
                      + 1);
    }
    local_298.asset_path_.field_2._M_allocated_capacity._0_4_ = 0x65737361;
    local_298.asset_path_.field_2._M_allocated_capacity._4_2_ = 0x74;
    local_298.asset_path_._M_string_length = 5;
    local_298.asset_path_._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.asset_path_._M_dataplus._M_p,
                      CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                        local_298.asset_path_.field_2._M_allocated_capacity._0_4_))
                      + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_248 == 0) {
LAB_00305c0d:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>>::value() const [T = tinyusdz::Animatable<tinyusdz::value::AssetPath>]"
                   );
    }
    print_typed_timesamples<tinyusdz::value::AssetPath>((string *)&local_298,&local_240._ts,indent);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_298.asset_path_._M_dataplus._M_p,
               local_298.asset_path_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.asset_path_._M_dataplus._M_p,
                      CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                        local_298.asset_path_.field_2._M_allocated_capacity._0_4_))
                      + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_((string *)&local_298,(pprint *)this,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_298.asset_path_._M_dataplus._M_p,
               local_298.asset_path_._M_string_length);
    paVar1 = &local_298.asset_path_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.asset_path_._M_dataplus._M_p,
                      CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                        local_298.asset_path_.field_2._M_allocated_capacity._0_4_))
                      + 1);
    }
    local_298.asset_path_.field_2._M_allocated_capacity._0_4_ = 0x65737361;
    local_298.asset_path_.field_2._M_allocated_capacity._4_2_ = 0x74;
    local_298.asset_path_._M_string_length = 5;
    local_298.asset_path_._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.asset_path_._M_dataplus._M_p,
                      CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                        local_298.asset_path_.field_2._M_allocated_capacity._0_4_))
                      + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar8 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar8 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar8 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  if (local_248 == 1) {
    nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
    destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)&local_240);
  }
LAB_00305bc7:
  psVar4 = local_250;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}